

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDepends
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  long lVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TargetType TVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  cmLocalGenerator *this_00;
  char *__s;
  long *plVar6;
  TargetDependSet *pTVar7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  size_type *psVar10;
  pointer pbVar11;
  string d;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  string local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  long *local_58 [2];
  long local_48 [2];
  _Base_ptr local_38;
  
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 == GLOBAL_TARGET) {
    psVar5 = cmGeneratorTarget::GetUtilities_abi_cxx11_(target);
    local_88 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (local_88 != local_38) {
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_80 + 0x10);
      do {
        this_00 = cmGeneratorTarget::GetLocalGenerator(target);
        __s = cmLocalGenerator::GetCurrentBinaryDirectory(this_00);
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"/","");
        strlen(__s);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,(ulong)__s);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_80.field_2._M_allocated_capacity = *psVar10;
          local_80.field_2._8_8_ = plVar6[3];
          local_80._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar10;
          local_80._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_80._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_80,*(ulong *)(local_88 + 1))
        ;
        pbVar11 = (pointer)(plVar6 + 2);
        if ((pointer)*plVar6 == pbVar11) {
          local_a8._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_a8._24_8_ = plVar6[3];
          local_a8._0_8_ = (pointer)(local_a8 + 0x10);
        }
        else {
          local_a8._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_a8._0_8_ = (pointer)*plVar6;
        }
        local_a8._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar3) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        ConvertToNinjaPath(&local_80,this,(string *)local_a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_60,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar3) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        local_88 = (_Base_ptr)std::_Rb_tree_increment(local_88);
      } while (local_88 != local_38);
    }
  }
  else {
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = (pointer)0x0;
    pTVar7 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
    p_Var8 = (pTVar7->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pbVar11 = (pointer)local_a8._0_8_;
    pbVar2 = (pointer)local_a8._8_8_;
    while (local_a8._0_8_ = pbVar11, local_a8._8_8_ = pbVar2,
          (_Rb_tree_header *)p_Var8 !=
          &(pTVar7->
           super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
           _M_t._M_impl.super__Rb_tree_header) {
      TVar4 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var8 + 1));
      if (TVar4 != INTERFACE_LIBRARY) {
        AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var8 + 1),(cmNinjaDeps *)local_a8,depends
                           );
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      pbVar11 = (pointer)local_a8._0_8_;
      pbVar2 = (pointer)local_a8._8_8_;
    }
    if (pbVar11 != pbVar2) {
      uVar9 = (long)pbVar2 - (long)pbVar11 >> 5;
      lVar1 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar11,pbVar2,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar11,pbVar2);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_60,*(undefined8 *)(local_60 + 8),local_a8._0_8_,local_a8._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDepends(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  if (target->GetType() == cmStateEnums::GLOBAL_TARGET) {
    // These depend only on other CMake-provided targets, e.g. "all".
    std::set<std::string> const& utils = target->GetUtilities();
    for (std::set<std::string>::const_iterator i = utils.begin();
         i != utils.end(); ++i) {
      std::string d =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() +
        std::string("/") + *i;
      outputs.push_back(this->ConvertToNinjaPath(d));
    }
  } else {
    cmNinjaDeps outs;
    cmTargetDependSet const& targetDeps = this->GetTargetDirectDepends(target);
    for (cmTargetDependSet::const_iterator i = targetDeps.begin();
         i != targetDeps.end(); ++i) {
      if ((*i)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->AppendTargetOutputs(*i, outs, depends);
    }
    std::sort(outs.begin(), outs.end());
    outputs.insert(outputs.end(), outs.begin(), outs.end());
  }
}